

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::Encrypt
          (LegacyScriptPubKeyMan *this,CKeyingMaterial *master_key,WalletBatch *batch)

{
  uchar *__first;
  bool bVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchCryptedSecret;
  CKeyingMaterial vchSecret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  CPubKey vchPubKey;
  KeyMap keys_to_encrypt;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_f8;
  unique_lock<std::recursive_mutex> local_e0;
  allocator_type local_c9 [32];
  CPubKey local_a9;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_e0,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x115,false);
  this->encrypted_batch = batch;
  if ((this->super_LegacyDataSPKM).mapCryptedKeys._M_t._M_impl.super__Rb_tree_header._M_node_count
      == 0) {
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::swap(&local_68,&(this->super_LegacyDataSPKM).super_FillableSigningProvider.mapKeys._M_t);
    for (p_Var2 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar3 = (_Rb_tree_header *)p_Var2 == &local_68._M_impl.super__Rb_tree_header, !bVar3;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
      CKey::GetPubKey(&local_a9,(CKey *)&p_Var2[1]._M_right);
      __first = *(uchar **)(p_Var2 + 2);
      std::vector<unsigned_char,secure_allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_f8,__first,
                 __first + (ulong)(__first != (uchar *)0x0) * 0x20,local_c9);
      local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CPubKey::GetHash((uint256 *)local_c9,&local_a9);
      bVar1 = EncryptSecret(master_key,(CKeyingMaterial *)&local_f8,(uint256 *)local_c9,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
      if (!bVar1) {
LAB_001ee54e:
        this->encrypted_batch = (WalletBatch *)0x0;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_118);
        std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_f8)
        ;
        goto LAB_001ee574;
      }
      bVar1 = AddCryptedKey(this,&local_a9,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
      if (!bVar1) goto LAB_001ee54e;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_118);
      std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_f8);
    }
    this->encrypted_batch = (WalletBatch *)0x0;
LAB_001ee574:
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_68);
  }
  else {
    this->encrypted_batch = (WalletBatch *)0x0;
    bVar3 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::Encrypt(const CKeyingMaterial& master_key, WalletBatch* batch)
{
    LOCK(cs_KeyStore);
    encrypted_batch = batch;
    if (!mapCryptedKeys.empty()) {
        encrypted_batch = nullptr;
        return false;
    }

    KeyMap keys_to_encrypt;
    keys_to_encrypt.swap(mapKeys); // Clear mapKeys so AddCryptedKeyInner will succeed.
    for (const KeyMap::value_type& mKey : keys_to_encrypt)
    {
        const CKey &key = mKey.second;
        CPubKey vchPubKey = key.GetPubKey();
        CKeyingMaterial vchSecret{UCharCast(key.begin()), UCharCast(key.end())};
        std::vector<unsigned char> vchCryptedSecret;
        if (!EncryptSecret(master_key, vchSecret, vchPubKey.GetHash(), vchCryptedSecret)) {
            encrypted_batch = nullptr;
            return false;
        }
        if (!AddCryptedKey(vchPubKey, vchCryptedSecret)) {
            encrypted_batch = nullptr;
            return false;
        }
    }
    encrypted_batch = nullptr;
    return true;
}